

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClearActiveID(void)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  GImGui->ActiveIdIsJustActivated = GImGui->ActiveId != 0;
  pIVar1->ActiveId = 0;
  pIVar1->ActiveIdAllowOverlap = false;
  pIVar1->ActiveIdWindow = (ImGuiWindow *)0x0;
  return;
}

Assistant:

void ImGui::SetActiveID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.ActiveIdIsJustActivated = (g.ActiveId != id);
    g.ActiveId = id;
    g.ActiveIdAllowOverlap = false;
    g.ActiveIdIsAlive |= (id != 0);
    g.ActiveIdWindow = window;
}